

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int filter(int *lb,int *ub,int col,char c)

{
  opcode_t *poVar1;
  char cVar2;
  int iVar3;
  
  poVar1 = opcodes + *lb;
  iVar3 = *lb + -1;
  while( true ) {
    if ((poVar1->str[col] == c) || (poVar1->str[col] == ' ' && c == '\0')) break;
    *lb = iVar3 + 2;
    poVar1 = poVar1 + 1;
    iVar3 = iVar3 + 1;
    if (*ub <= iVar3) {
      return 0;
    }
  }
  iVar3 = *ub;
  cVar2 = opcodes[iVar3].str[col];
  if (cVar2 != c) {
    poVar1 = opcodes + iVar3;
    do {
      iVar3 = iVar3 + -1;
      poVar1 = poVar1 + -1;
      if ((c == '\0') && (cVar2 == ' ')) {
        return 1;
      }
      *ub = iVar3;
      cVar2 = poVar1->str[col];
    } while (cVar2 != c);
  }
  return 1;
}

Assistant:

int filter(int *lb, int *ub, int col, char c)
{
    while (opcodes[*lb].str[col] != c)
    {
        if (!c && opcodes[*lb].str[col] == ' ')
            break;

        ++*lb;
        if (*lb > *ub)
            return 0;
    }

    while (opcodes[*ub].str[col] != c)
    {
        if (!c && opcodes[*ub].str[col] == ' ')
            break;

        --*ub;
    }

    return 1;
}